

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::ScopedProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,PropertyIdIndexType propertyIdIndex,
          bool forceStrictMode)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_24;
  bool success;
  PropertyIdIndexType local_1c;
  RegSlot RStack_18;
  bool forceStrictMode_local;
  PropertyIdIndexType propertyIdIndex_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  success = forceStrictMode;
  local_1c = propertyIdIndex;
  RStack_18 = value;
  propertyIdIndex_local._2_2_ = op;
  _value_local = this;
  CheckOpen(this);
  op_00 = propertyIdIndex_local._2_2_;
  OpLayoutType::OpLayoutType(&local_24,ElementScopedC);
  CheckOp(this,op_00,local_24);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(propertyIdIndex_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5ba,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  RStack_18 = ConsumeReg(this,RStack_18);
  if (((propertyIdIndex_local._2_2_ != ScopedEnsureNoRedeclFld) &&
      (propertyIdIndex_local._2_2_ != ScopedInitFunc)) &&
     (propertyIdIndex_local._2_2_ != ScopedDeleteFld)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5c8,"(false)",
                                "The specified OpCode is not intended for scoped field-access");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ParseableFunctionInfo::GetIsStrictMode
                    (&this->m_functionWrite->super_ParseableFunctionInfo);
  if (((bVar2) || ((success & 1U) != 0)) && (propertyIdIndex_local._2_2_ == ScopedDeleteFld)) {
    propertyIdIndex_local._2_2_ = ScopedDeleteFldStrict;
  }
  bVar2 = TryWriteElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,propertyIdIndex_local._2_2_,RStack_18,local_1c);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,propertyIdIndex_local._2_2_,RStack_18,local_1c), !bVar2)) &&
     (bVar2 = TryWriteElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,propertyIdIndex_local._2_2_,RStack_18,local_1c), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5d5,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::ScopedProperty(OpCode op, RegSlot value, PropertyIdIndexType propertyIdIndex, bool forceStrictMode)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementScopedC);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

#if DBG
        switch (op)
        {
        case OpCode::ScopedDeleteFld:
        case OpCode::ScopedEnsureNoRedeclFld:
        case OpCode::ScopedInitFunc:
            break;


        default:
            AssertMsg(false, "The specified OpCode is not intended for scoped field-access");
            break;
        }
#endif

        if (this->m_functionWrite->GetIsStrictMode() || forceStrictMode)
        {
            if (op == OpCode::ScopedDeleteFld)
            {
                op = OpCode::ScopedDeleteFldStrict;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementScopedC, op, value, propertyIdIndex);
    }